

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O2

void __thiscall
embree::InstanceArray::setInstancedScenes(InstanceArray *this,RTCScene *scenes,size_t numScenes)

{
  Device *pDVar1;
  RTCScene pRVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t i;
  ulong uVar4;
  
  if (this->objects != (Accel **)0x0) {
    for (uVar4 = 0; uVar4 < this->numObjects; uVar4 = uVar4 + 1) {
      if (this->objects[uVar4] != (Accel *)0x0) {
        (*(this->objects[uVar4]->super_AccelData).super_RefCount._vptr_RefCount[3])();
      }
    }
    pDVar1 = (this->super_Geometry).device;
    (*(pDVar1->super_State).super_RefCount._vptr_RefCount[9])(pDVar1,this->objects);
    pDVar1 = (this->super_Geometry).device;
    (*(pDVar1->super_State).super_RefCount._vptr_RefCount[4])(pDVar1,(ulong)this->numObjects * -8,1)
    ;
  }
  this->numObjects = (uint32_t)numScenes;
  pDVar1 = (this->super_Geometry).device;
  (*(pDVar1->super_State).super_RefCount._vptr_RefCount[4])(pDVar1,numScenes << 3 & 0x7fffffff8,0);
  pDVar1 = (this->super_Geometry).device;
  iVar3 = (*(pDVar1->super_State).super_RefCount._vptr_RefCount[8])(pDVar1,numScenes << 3,0x10,3);
  this->objects = (Accel **)CONCAT44(extraout_var,iVar3);
  for (uVar4 = 0; uVar4 < this->numObjects; uVar4 = uVar4 + 1) {
    pRVar2 = scenes[uVar4];
    if (pRVar2 != (RTCScene)0x0) {
      (**(code **)(*(long *)pRVar2 + 0x10))(pRVar2);
    }
    this->objects[uVar4] = (Accel *)pRVar2;
    if (this->objects[uVar4] != (Accel *)0x0) {
      (*(this->objects[uVar4]->super_AccelData).super_RefCount._vptr_RefCount[2])();
    }
    if (pRVar2 != (RTCScene)0x0) {
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
    }
  }
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void InstanceArray::setInstancedScenes(const RTCScene* scenes, size_t numScenes) {
    if (objects) {
      for (size_t i = 0; i < numObjects; ++i) {
        if (objects[i]) objects[i]->refDec();
      }
      device->free(objects);
      device->memoryMonitor(-ssize_t(numObjects*sizeof(Accel*)), true);
    }

    numObjects = numScenes;
    device->memoryMonitor(numObjects*sizeof(Accel*), false);
    objects = (Accel**) device->malloc(numScenes*sizeof(Accel*),16,EmbreeMemoryType::MALLOC);
    for (size_t i = 0; i < numObjects; ++i) {
      Ref<Scene> scene = (Scene*) scenes[i];
      objects[i] = scene.ptr;
      if (objects[i]) objects[i]->refInc();
    }
    Geometry::update();
  }